

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fverify.c
# Opt level: O0

void fverify(void)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  FILE *pFVar4;
  char *status_str [2];
  float fversion;
  FILE *out;
  FILE *list;
  int nerrs;
  int i;
  int fwarn;
  int ferror;
  int filestatus;
  int vfstatus;
  int status;
  char *p;
  char outfile [1025];
  char infile [1025];
  char *in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  char *title;
  float in_stack_fffffffffffff7ac;
  char fill;
  FILE *local_848;
  uint local_83c;
  int local_838;
  int local_824;
  char *local_820;
  char local_818;
  char acStack_817 [1039];
  char local_408;
  char acStack_407 [215];
  FILE *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  
  memset(&local_408,0,0x401);
  memset(&local_818,0,0x401);
  local_824 = 0;
  local_848 = (FILE *)0x0;
  iVar2 = (int)((ulong)"OK    " >> 0x20);
  title = "FAILED";
  c_ptaskn((char *)0x106799);
  iVar1 = init_fverify(&local_408,&local_818,&local_824);
  if (iVar1 == 0) {
    if (local_408 == '@') {
      local_820 = acStack_407;
      local_848 = fopen64(local_820,"r");
      if (local_848 == (FILE *)0x0) {
        sprintf(errmes,"Can not open the list file: %s.",local_820);
        c_fcerr((char *)0x10684c);
        leave_early((FILE *)0x106855);
        return;
      }
    }
    local_820 = &local_818;
    if (local_818 == '!') {
      local_820 = acStack_817;
    }
    else if ((((prstat != 0) && (sVar3 = strlen(local_820), sVar3 != 0)) &&
             (iVar1 = strcmp(local_820,"STDOUT"), iVar1 != 0)) &&
            (pFVar4 = fopen64(local_820,"r"), pFVar4 != (FILE *)0x0)) {
      sprintf(errmes,"Clobber is not set. Can not overwrite the file %s.",local_820);
      c_fcerr((char *)0x1068fb);
      leave_early((FILE *)0x106904);
      fclose(pFVar4);
      return;
    }
    if ((prstat == 0) ||
       ((sVar3 = strlen(local_820), pFVar4 = _stdout, sVar3 != 0 &&
        (iVar1 = strcmp(local_820,"STDOUT"), pFVar4 = _stdout, iVar1 != 0)))) {
      if (prstat == 0) {
        pFVar4 = (FILE *)0x0;
      }
      else {
        pFVar4 = fopen64(local_820,"w");
        if (pFVar4 == (FILE *)0x0) {
          sprintf(errmes,"Error opening Ouputput file %s. Using stdout instead.",&local_818);
          c_fcerr((char *)0x1069ad);
          pFVar4 = _stdout;
        }
      }
    }
    wrtout((FILE *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
           in_stack_fffffffffffff788);
    ffvers((float *)&stack0xfffffffffffff7ac);
    sprintf(comm,"%s (CFITSIO V%.3f)",(double)in_stack_fffffffffffff7ac,task);
    fill = (char)((uint)in_stack_fffffffffffff7ac >> 0x18);
    wrtsep((FILE *)pFVar4,fill,title,iVar2);
    for (local_838 = 0; comm[local_838] != '\0'; local_838 = local_838 + 1) {
      comm[local_838] = '-';
    }
    wrtsep((FILE *)pFVar4,fill,title,iVar2);
    wrtout((FILE *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
           in_stack_fffffffffffff788);
    iVar1 = err_report;
    if (((err_report != 0) && (err_report != 1)) && (err_report == 2)) {
      sprintf(comm,"Caution: Only checking for the most severe FITS format errors.");
      wrtout((FILE *)CONCAT44(iVar1,in_stack_fffffffffffff790),in_stack_fffffffffffff788);
    }
    if (heasarc_conv != 0) {
      sprintf(comm,"HEASARC conventions are being checked.");
      wrtout((FILE *)CONCAT44(iVar1,in_stack_fffffffffffff790),in_stack_fffffffffffff788);
    }
    if (local_848 == (FILE *)0x0) {
      iVar1 = verify_fits(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      if (pFVar4 == (FILE *)0x0) {
        if (iVar1 == 0) {
          local_83c = get_total_err();
        }
        else {
          local_83c = 1;
        }
        printf("verification %s: %-20s  nerrors=%d\n",
               *(undefined8 *)(&stack0xfffffffffffff798 + (long)(int)(uint)(0 < (int)local_83c) * 8)
               ,&local_408,(ulong)local_83c);
      }
    }
    else {
      while (local_820 = fgets(&local_408,0x401,local_848), local_820 != (char *)0x0) {
        iVar2 = verify_fits(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        if (pFVar4 == (FILE *)0x0) {
          if (iVar2 == 0) {
            local_83c = get_total_err();
          }
          else {
            local_83c = 1;
          }
          printf("verification %s: %-20s  nerrors=%d\n",
                 *(undefined8 *)
                  (&stack0xfffffffffffff798 + (long)(int)(uint)(0 < (int)local_83c) * 8),&local_408,
                 (ulong)local_83c);
        }
        for (local_838 = 1; local_838 < 3; local_838 = local_838 + 1) {
          wrtout((FILE *)CONCAT44(iVar1,in_stack_fffffffffffff790),in_stack_fffffffffffff788);
        }
      }
      fclose(local_848);
    }
    if ((pFVar4 != _stdout) && (pFVar4 != (FILE *)0x0)) {
      fclose(pFVar4);
    }
  }
  else {
    strcpy(errmes,"Errors in init_fverfify.");
    c_fcerr((char *)0x1067d4);
    leave_early((FILE *)0x1067dd);
  }
  return;
}

Assistant:

void fverify()
{ 
    char infile[FLEN_FILENAME] = "";  	/* Input Fits file */
    char outfile[FLEN_FILENAME] = "";  	/* output ASCII file */
    char *p;
    int status = 0, vfstatus = 0, filestatus, ferror, fwarn;
    int i, nerrs; 
    FILE* list = NULL;
    FILE *out;				/* output ASCII file pointer */
    float fversion;
    char *status_str[] = {"OK    ", "FAILED"};

    /*------------------Initialization  --------------------------------*/

    c_ptaskn(task);

    /* get the input parameters from parameter file*/
    if(init_fverify(infile, outfile, &status) ) {
        strcpy(errmes,"Errors in init_fverfify.");
        c_fcerr(errmes);
	leave_early(NULL);
	return;
    } 

    /* if infile name has @ in front of it, then it is a file of a list */ 
    p = infile; 
    if (*p == '@') { 
         p++;
	 if( (list = fopen(p,"r")) == NULL ) { 
	        sprintf(errmes,
		    "Can not open the list file: %s.",p);
                c_fcerr(errmes);
	        leave_early(NULL);
		return;
         } 
    }     

    /* if the outfile is given, open it, otherwise, use stdout */
    p = outfile;
    if(*p == '!') { 
	p++;
    } 
    else { 
        if(prstat && strlen(p) && strcmp(p, "STDOUT")) { 
	    if( (out = fopen(p,"r")) != NULL ) { 
	        sprintf(errmes,
		    "Clobber is not set. Can not overwrite the file %s.",p);
                c_fcerr(errmes);
	        leave_early(NULL);
		fclose(out);
		return;
            }
        }
    }

    if(prstat && (!strlen(p) || !strcmp(p, "STDOUT"))) {  
	out = stdout;
    }
    else if (!prstat) {
       out=NULL;
    }  
    else if( (out = fopen(p,"w") ) == NULL) {
            sprintf(errmes,
               "Error opening Ouputput file %s. Using stdout instead.",
	       outfile);
            c_fcerr(errmes);
	    out = stdout;
    }

    wrtout(out," ");
    fits_get_version(&fversion);
    sprintf(comm,"%s (CFITSIO V%.3f)",task,fversion);
    wrtsep(out,' ',comm,75);
    for(i = 0; comm[i]!='\0'; i++) comm[i] = '-';
    wrtsep(out,' ',comm,75);
    wrtout(out," ");
    switch (err_report) {
    case 2:
    sprintf(comm, "Caution: Only checking for the most severe FITS format errors.");
        wrtout(out,comm);
        break;
    case 1:
        break;
    case 0:
        break;
    }

    if(heasarc_conv) {
        sprintf(comm, "HEASARC conventions are being checked.");
	wrtout(out,comm);
    }     

    /* process each file */ 
    if (list == NULL) { 
        vfstatus = verify_fits(infile,out);  

        if (out == NULL) {  /* print one-line file summary */

           /* verify_fits returns a non-zero status for catastrophic
            * file I/O problems (an abort), and in this case total_err
            * is not updated via close_report(), so we need to set
            * nerrs accordingly for the one-line file summary. */
           if (vfstatus) nerrs = 1; else nerrs = get_total_err();

           filestatus = (nerrs>0) ? 1 : 0;
           printf("verification %s: %-20s  nerrors=%d\n", status_str[filestatus],
                   infile, nerrs); 
        }        
    } 
    else { 
       while((p = fgets(infile, FLEN_FILENAME, list))!= NULL) {      
           vfstatus = verify_fits(infile,out);   

           if (out == NULL) { /* print one-line file summary */

              /* verify_fits returns a non-zero status for catastrophic
               * file I/O problems (an abort), and in this case total_err
               * is not updated via close_report(), so we need to set
               * nerrs accordingly for the one-line file summary. */
              if (vfstatus) nerrs = 1; else nerrs = get_total_err();

              filestatus = (nerrs>0) ? 1 : 0;
              printf("verification %s: %-20s  nerrors=%d\n",
                 status_str[filestatus], infile, nerrs); 
           }        

           for (i = 1; i < 3; i++) wrtout(out," ");
       }
       fclose(list);
    }        
 
    /* close the output file  */ 
    if (out != stdout && out != NULL) fclose(out);

    return;
}